

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O1

void destroy_expectation_if_time_to_die(RecordedExpectation *expectation)

{
  char *__s2;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  
  iVar2 = expectation->time_to_live;
  if ((iVar2 == 0xf314159) || (expectation->time_to_live = iVar2 + -1, 1 < iVar2)) {
    return;
  }
  __s2 = expectation->function;
  iVar2 = cgreen_vector_size(global_expectation_queue);
  if (0 < iVar2) {
    iVar2 = 0;
    do {
      puVar4 = (undefined8 *)cgreen_vector_get(global_expectation_queue,iVar2);
      if (puVar4 == (undefined8 *)0x0) {
        __fprintf_chk(_stderr,1,
                      "*** CGREEN: NULL expectation found -- maybe a previous incorrect removal?");
        bVar1 = false;
      }
      else {
        iVar3 = strcmp((char *)*puVar4,__s2);
        bVar1 = false;
        if (iVar3 == 0) {
          cgreen_vector_remove(global_expectation_queue,iVar2);
          bVar1 = true;
        }
      }
      if (bVar1) break;
      iVar2 = iVar2 + 1;
      iVar3 = cgreen_vector_size(global_expectation_queue);
    } while (iVar2 < iVar3);
  }
  destroy_cgreen_vector(expectation->constraints);
  expectation->test_line = 0;
  expectation->time_to_live = 0;
  expectation->constraints = (CgreenVector *)0x0;
  expectation->function = (char *)0x0;
  expectation->test_file = (char *)0x0;
  expectation->number_times_called = 0;
  expectation->times_triggered = 0;
  free(expectation);
  return;
}

Assistant:

static void destroy_expectation_if_time_to_die(RecordedExpectation *expectation) {

    if (is_always_call(expectation)) {
        return;
    }

    /* TODO: expectation->decrement_time_to_live_if_necessary(); if (expectation->time_to_die()) { ... } */
    expectation->time_to_live--;

    if (expectation->time_to_live <= 0) {
        remove_expectation_for(expectation->function);
        destroy_expectation(expectation);
    }
}